

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

void luaO_chunkid(char *out,char *source,size_t srclen)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  size_t __n;
  
  if (*source == '@') {
    if (srclen < 0x3d) {
LAB_00148452:
      memcpy(out,source + 1,srclen);
      return;
    }
    out[2] = '.';
    out[0] = '.';
    out[1] = '.';
    uVar1 = *(undefined8 *)(source + (srclen - 0x38) + 8);
    uVar2 = *(undefined8 *)(source + (srclen - 0x28));
    uVar3 = *(undefined8 *)(source + (srclen - 0x28) + 8);
    uVar4 = *(undefined8 *)(source + (srclen - 0x18));
    uVar5 = *(undefined8 *)(source + (srclen - 0x18) + 8);
    uVar6 = *(undefined8 *)(source + (srclen - 0xf));
    uVar7 = *(undefined8 *)(source + (srclen - 0xf) + 8);
    *(undefined8 *)(out + 3) = *(undefined8 *)(source + (srclen - 0x38));
    *(undefined8 *)(out + 0xb) = uVar1;
    *(undefined8 *)(out + 0x13) = uVar2;
    *(undefined8 *)(out + 0x1b) = uVar3;
    *(undefined8 *)(out + 0x23) = uVar4;
    *(undefined8 *)(out + 0x2b) = uVar5;
    *(undefined8 *)(out + 0x2c) = uVar6;
    *(undefined8 *)(out + 0x34) = uVar7;
  }
  else if (*source == '=') {
    if (srclen < 0x3d) goto LAB_00148452;
    uVar1 = *(undefined8 *)(source + 1);
    uVar2 = *(undefined8 *)(source + 9);
    uVar3 = *(undefined8 *)(source + 0x11);
    uVar4 = *(undefined8 *)(source + 0x19);
    uVar5 = *(undefined8 *)(source + 0x21);
    uVar6 = *(undefined8 *)(source + 0x29);
    uVar7 = *(undefined8 *)(source + 0x34);
    *(undefined8 *)(out + 0x2b) = *(undefined8 *)(source + 0x2c);
    *(undefined8 *)(out + 0x33) = uVar7;
    *(undefined8 *)(out + 0x20) = uVar5;
    *(undefined8 *)(out + 0x28) = uVar6;
    *(undefined8 *)(out + 0x10) = uVar3;
    *(undefined8 *)(out + 0x18) = uVar4;
    *(undefined8 *)out = uVar1;
    *(undefined8 *)(out + 8) = uVar2;
    out[0x3b] = '\0';
  }
  else {
    pcVar8 = strchr(source,10);
    builtin_strncpy(out,"[string \"",9);
    pcVar10 = out + 9;
    if (pcVar8 == (char *)0x0 && srclen < 0x2d) {
      memcpy(pcVar10,source,srclen);
      pcVar10 = pcVar10 + srclen;
    }
    else {
      uVar9 = (long)pcVar8 - (long)source;
      if (pcVar8 == (char *)0x0) {
        uVar9 = srclen;
      }
      __n = 0x2d;
      if (uVar9 < 0x2d) {
        __n = uVar9;
      }
      memcpy(pcVar10,source,__n);
      pcVar8 = pcVar10 + __n;
      pcVar10 = pcVar8 + 3;
      pcVar8[0] = '.';
      pcVar8[1] = '.';
      pcVar8[2] = '.';
    }
    pcVar10[2] = '\0';
    pcVar10[0] = '\"';
    pcVar10[1] = ']';
  }
  return;
}

Assistant:

void luaO_chunkid (char *out, const char *source, size_t srclen) {
  size_t bufflen = LUA_IDSIZE;  /* free space in buffer */
  if (*source == '=') {  /* 'literal' source */
    if (srclen <= bufflen)  /* small enough? */
      memcpy(out, source + 1, srclen * sizeof(char));
    else {  /* truncate it */
      addstr(out, source + 1, bufflen - 1);
      *out = '\0';
    }
  }
  else if (*source == '@') {  /* file name */
    if (srclen <= bufflen)  /* small enough? */
      memcpy(out, source + 1, srclen * sizeof(char));
    else {  /* add '...' before rest of name */
      addstr(out, RETS, LL(RETS));
      bufflen -= LL(RETS);
      memcpy(out, source + 1 + srclen - bufflen, bufflen * sizeof(char));
    }
  }
  else {  /* string; format as [string "source"] */
    const char *nl = strchr(source, '\n');  /* find first new line (if any) */
    addstr(out, PRE, LL(PRE));  /* add prefix */
    bufflen -= LL(PRE RETS POS) + 1;  /* save space for prefix+suffix+'\0' */
    if (srclen < bufflen && nl == NULL) {  /* small one-line source? */
      addstr(out, source, srclen);  /* keep it */
    }
    else {
      if (nl != NULL) srclen = nl - source;  /* stop at first newline */
      if (srclen > bufflen) srclen = bufflen;
      addstr(out, source, srclen);
      addstr(out, RETS, LL(RETS));
    }
    memcpy(out, POS, (LL(POS) + 1) * sizeof(char));
  }
}